

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestDyndepNotInput::Run(ParserTestDyndepNotInput *this)

{
  Test *pTVar1;
  bool bVar2;
  string err;
  ManifestParser parser;
  State lstate;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  ManifestParser local_178;
  State local_118;
  
  State::State(&local_118);
  ManifestParser::ManifestParser(&local_178,&local_118,(FileReader *)0x0,(ManifestParserOptions)0x0)
  ;
  pTVar1 = g_current_test;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,
             "rule touch\n  command = touch $out\nbuild result: touch\n  dyndep = notin\n",
             &local_1b9);
  bVar2 = ManifestParser::ParseTest(&local_178,&local_198,&local_1b8);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x454,
             "parser.ParseTest( \"rule touch\\n\" \"  command = touch $out\\n\" \"build result: touch\\n\" \"  dyndep = notin\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_198);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:5: dyndep \'notin\' is not an input\n",&local_1b8);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x455,"\"input:5: dyndep \'notin\' is not an input\\n\" == err");
  std::__cxx11::string::~string((string *)&local_1b8);
  State::~State(&local_118);
  return;
}

Assistant:

TEST_F(ParserTest, DyndepNotInput) {
  State lstate;
  ManifestParser parser(&lstate, NULL);
  string err;
  EXPECT_FALSE(parser.ParseTest(
"rule touch\n"
"  command = touch $out\n"
"build result: touch\n"
"  dyndep = notin\n",
                               &err));
  EXPECT_EQ("input:5: dyndep 'notin' is not an input\n", err);
}